

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OledI2C.cxx
# Opt level: O2

bool __thiscall SSD1306::OledI2C::isSetPixel(OledI2C *this,OledPoint p)

{
  ulong uVar1;
  bool bVar2;
  
  bVar2 = OledPixel::pixelInside(&this->super_OledPixel,p);
  if (bVar2) {
    uVar1 = (ulong)(uint)(p.m_x >> 0x1f) << 0x20 | (ulong)p & 0xffffffff;
    bVar2 = ((this->blocks_)._M_elems
             [(int)((long)uVar1 / 0x20) +
              (int)((long)((ulong)(uint)(p.m_y >> 0x1f) << 0x20 | (ulong)p >> 0x20) / 8) * 4].bytes_
             ._M_elems[(long)(int)((long)uVar1 % 0x20) + 1] >> (p.m_y & 7U) & 1) != 0;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool
SSD1306::OledI2C::isSetPixel(
    SSD1306::OledPoint p) const
{
    if (not pixelInside(p))
    {
        return false;
    }

    PixelOffset po{p};

    return blocks_[po.block].bytes_[po.byte] & (1 << po.bit);
}